

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_symbol_internWithString(sysbvm_context_t *context,size_t stringSize,char *string)

{
  _Bool _Var1;
  size_t sVar2;
  sysbvm_tuple_t existent;
  sysbvm_stringSlice_t stringSlice;
  sysbvm_object_tuple_t *local_38;
  char *local_30;
  size_t local_28;
  
  local_30 = string;
  local_28 = stringSize;
  _Var1 = sysbvm_identitySet_findWithExplicitHash
                    (context,(context->roots).internedSymbolSet,&local_30,
                     sysbvm_stringSliceSymbol_hashFunction,sysbvm_stringSlice_equalsFunction,
                     (sysbvm_tuple_t *)&local_38);
  if (!_Var1) {
    local_38 = sysbvm_context_allocateByteTuple
                         (context,(context->roots).stringSymbolType,stringSize);
    if (local_38 == (sysbvm_object_tuple_t *)0x0) {
      local_38 = (sysbvm_object_tuple_t *)0x0;
    }
    else {
      sVar2 = sysbvm_string_computeHashWithBytes(stringSize,(uint8_t *)string);
      (local_38->header).identityHashAndFlags =
           (int)sVar2 << 10 | (local_38->header).identityHashAndFlags & 0x3ff;
      memcpy(&local_38->field_1,string,stringSize);
      sysbvm_identitySet_insert(context,(context->roots).internedSymbolSet,(sysbvm_tuple_t)local_38)
      ;
    }
  }
  return (sysbvm_tuple_t)local_38;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_symbol_internWithString(sysbvm_context_t *context, size_t stringSize, const char *string)
{
    {
        sysbvm_stringSlice_t stringSlice = {
            .elements = string,
            .size = stringSize
        };

        sysbvm_tuple_t existent;
        if(sysbvm_identitySet_findWithExplicitHash(context, context->roots.internedSymbolSet, &stringSlice, sysbvm_stringSliceSymbol_hashFunction, sysbvm_stringSlice_equalsFunction, &existent))
            return existent;
    }

    sysbvm_object_tuple_t *result = sysbvm_context_allocateByteTuple(context, context->roots.stringSymbolType, stringSize);
    if(!result) return 0;

    // In the case of symbols, make the identity hash match with the string hash.
    sysbvm_tuple_setIdentityHash(result, sysbvm_string_computeHashWithBytes(stringSize, (const uint8_t*)string));

    memcpy(result->bytes, string, stringSize);
    sysbvm_identitySet_insert(context, context->roots.internedSymbolSet, (sysbvm_tuple_t)result);
    return (sysbvm_tuple_t)result;
}